

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O0

int nni_listener_getopt(nni_listener *l,char *name,void *val,size_t *szp,nni_type t)

{
  int iVar1;
  bool bVar2;
  nni_option *pnStack_40;
  int rv;
  nni_option *o;
  nni_type t_local;
  size_t *szp_local;
  void *val_local;
  char *name_local;
  nni_listener *l_local;
  
  if (((l->l_ops).l_getopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) ||
     (l_local._4_4_ = (*(l->l_ops).l_getopt)(l->l_data,name,val,szp,t), l_local._4_4_ == 9)) {
    pnStack_40 = (l->l_ops).l_options;
    while( true ) {
      bVar2 = false;
      if (pnStack_40 != (nni_option *)0x0) {
        bVar2 = pnStack_40->o_name != (char *)0x0;
      }
      if (!bVar2) {
        iVar1 = nni_sock_getopt(l->l_sock,name,val,szp,t);
        return iVar1;
      }
      iVar1 = strcmp(pnStack_40->o_name,name);
      if (iVar1 == 0) break;
      pnStack_40 = pnStack_40 + 1;
    }
    if (pnStack_40->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
      l_local._4_4_ = 0x19;
    }
    else {
      l_local._4_4_ = (*pnStack_40->o_get)(l->l_data,val,szp,t);
    }
  }
  return l_local._4_4_;
}

Assistant:

int
nni_listener_getopt(
    nni_listener *l, const char *name, void *val, size_t *szp, nni_type t)
{
	nni_option *o;

	if (l->l_ops.l_getopt != NULL) {
		int rv = l->l_ops.l_getopt(l->l_data, name, val, szp, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = l->l_ops.l_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_get == NULL) {
			return (NNG_EWRITEONLY);
		}
		return (o->o_get(l->l_data, val, szp, t));
	}

	return (nni_sock_getopt(l->l_sock, name, val, szp, t));
}